

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O2

uchar * __thiscall ON_WindowsBitmap::Bits(ON_WindowsBitmap *this,int scan_index)

{
  ON_WindowsBITMAPINFO *pOVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uchar *puVar4;
  ON_WindowsRGBQUAD *pOVar5;
  
  iVar2 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1b])()
  ;
  pOVar1 = this->m_bmi;
  if (pOVar1 == (ON_WindowsBITMAPINFO *)0x0) {
    pOVar5 = (ON_WindowsRGBQUAD *)0x0;
  }
  else {
    iVar3 = PaletteColorCount(this);
    pOVar5 = pOVar1->bmiColors + iVar3;
  }
  puVar4 = (uchar *)0x0;
  if (((-1 < scan_index) && (CONCAT44(extraout_var,iVar2) != 0)) &&
     (pOVar5 != (ON_WindowsRGBQUAD *)0x0)) {
    iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x19])
                      (this);
    if (scan_index < iVar3) {
      puVar4 = &pOVar5->rgbBlue + CONCAT44(extraout_var,iVar2) * (ulong)(uint)scan_index;
    }
    else {
      puVar4 = (uchar *)0x0;
    }
  }
  return puVar4;
}

Assistant:

const unsigned char* ON_WindowsBitmap::Bits(int scan_index) const
{
  const size_t sizeof_scan = SizeofScan();
  const unsigned char* bits = m_bmi ? (const unsigned char*)&m_bmi->bmiColors[PaletteColorCount()] : 0;
  if ( bits && sizeof_scan && scan_index >= 0 && scan_index < Height() ) {
    bits += (sizeof_scan*scan_index);
  }
  else {
    bits = 0;
  }
  return bits;
}